

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_group_norm_impl(ggml_context *ctx,ggml_tensor *a,int n_groups,float eps,_Bool inplace)

{
  ggml_tensor *pgVar1;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,inplace) == 0) {
    pgVar1 = ggml_dup_tensor(ctx,a);
  }
  else {
    pgVar1 = ggml_view_tensor(ctx,a);
  }
  pgVar1->op_params[0] = n_groups;
  pgVar1->op_params[1] = (int32_t)eps;
  pgVar1->op = GGML_OP_GROUP_NORM;
  pgVar1->src[0] = a;
  return pgVar1;
}

Assistant:

static struct ggml_tensor * ggml_group_norm_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_groups,
        float                 eps,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params_i32(result, 0, n_groups);
    ggml_set_op_params_f32(result, 1, eps);

    result->op     = GGML_OP_GROUP_NORM;
    result->src[0] = a;

    return result;
}